

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O3

int process_command(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  mraa_result_t mVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint8_t data;
  byte local_3d;
  uint local_3c;
  long local_38;
  
  __s1 = argv[1];
  iVar1 = strncmp(__s1,"help",5);
  if (iVar1 == 0) {
    print_help();
    return 0;
  }
  iVar1 = strncmp(__s1,"version",8);
  if (iVar1 == 0) {
    print_version();
    return 0;
  }
  iVar1 = strncmp(__s1,"list",5);
  if (iVar1 == 0) {
    print_busses();
    return 0;
  }
  iVar1 = strncmp(__s1,"detect",7);
  if (iVar1 == 0) {
    if (argc == 3) {
      lVar3 = strtol(argv[2],(char **)0x0,0);
      i2c_detect_devices((int)lVar3);
      return 0;
    }
  }
  else {
    iVar1 = strncmp(__s1,"get",4);
    if ((iVar1 == 0) || (iVar1 = strncmp(__s1,"getrpt",7), iVar1 == 0)) {
      if (argc == 5) {
        iVar1 = strncmp(__s1,"getrpt",7);
        local_38 = strtol(argv[2],(char **)0x0,0);
        lVar3 = strtol(argv[3],(char **)0x0,0);
        lVar4 = strtol(argv[4],(char **)0x0,0);
        local_3c = (uint)lVar4 & 0xff;
        uVar7 = 0;
        do {
          mVar2 = i2c_get((int)local_38,(uint8_t)lVar3,(uint8_t)lVar4,&local_3d);
          if (mVar2 == MRAA_SUCCESS) {
            if (iVar1 == 0) {
              fprintf(_stdout,"%4d: ",uVar7);
            }
            iVar8 = 0;
            fprintf(_stdout,"Register %#02X = %#02X\n",(ulong)local_3c,(ulong)local_3d);
          }
          else {
            fwrite("i2c get failed\n",0xf,1,_stdout);
            iVar8 = 1;
          }
          uVar7 = (ulong)((int)uVar7 + 1);
          usleep(10000);
        } while (mVar2 == MRAA_SUCCESS && iVar1 == 0);
        return iVar8;
      }
    }
    else {
      iVar1 = strncmp(__s1,"set",4);
      if (iVar1 == 0) {
        if (argc != 6) {
          print_command_error();
          return 1;
        }
        lVar3 = strtol(argv[2],(char **)0x0,0);
        lVar4 = strtol(argv[3],(char **)0x0,0);
        lVar5 = strtol(argv[4],(char **)0x0,0);
        lVar6 = strtol(argv[5],(char **)0x0,0);
        fprintf(_stdout,"Device %02X, Register = %02X, Value = %02X\n",(ulong)((uint)lVar4 & 0xff),
                (ulong)((uint)lVar5 & 0xff),(ulong)((uint)lVar6 & 0xff));
        mVar2 = i2c_set((int)lVar3,(uint8_t)lVar4,(uint8_t)lVar5,(uint8_t)lVar6);
        if (mVar2 == MRAA_SUCCESS) {
          return 1;
        }
        fwrite("i2c set failed\n",0xf,1,_stdout);
        return 0;
      }
    }
  }
  fwrite("Invalid command, options are:\n",0x1e,1,_stdout);
  print_help();
  return 1;
}

Assistant:

int
process_command(int argc, char** argv)
{
    int status = 0;
    if (strncmp(argv[1], "help", strlen("help") + 1) == 0) {
        print_help();
        return 0;
    } else if (strncmp(argv[1], "version", strlen("version") + 1) == 0) {
        print_version();
        return 0;
    } else if (strncmp(argv[1], "list", strlen("list") + 1) == 0) {
        print_busses();
        return 0;
    } else if (strncmp(argv[1], "detect", strlen("detect") + 1) == 0) {
        if (argc == 3) {
            int bus = strtol(argv[2], NULL, 0);
            i2c_detect_devices(bus);
            return 0;
        } else {
            print_command_error();
            return 1;
        }
    } else if ((strncmp(argv[1], "get", strlen("get") + 1) == 0) ||
               (strncmp(argv[1], "getrpt", strlen("getrpt") + 1) == 0)) {
        if (argc == 5) {
            int interation = 0;
            mraa_boolean_t should_repeat = strncmp(argv[1], "getrpt", strlen("getrpt") + 1) == 0;
            int bus = strtol(argv[2], NULL, 0);
            uint8_t device_address = strtol(argv[3], NULL, 0);
            uint8_t register_address = strtol(argv[4], NULL, 0);
            // fprintf(stdout, "Device %02X, Register = %02X\n", device_address, register_address);
            uint8_t data;
            do {
                if (i2c_get(bus, device_address, register_address, &data) == MRAA_SUCCESS) {
                    if (should_repeat)
                        fprintf(stdout, "%4d: ", interation);
                    fprintf(stdout, "Register %#02X = %#02X\n", register_address, data);
                    status = 0;
                } else {
                    fprintf(stdout, "i2c get failed\n");
                    status = 1;
                }
                interation++;
                usleep(10000);
            } while (should_repeat && status == 0);
        } else {
            print_command_error();
            status = 1;
        }
        return status;
    } else if ((strncmp(argv[1], "set", strlen("set") + 1) == 0)) {
        if (argc == 6) {
            int bus = strtol(argv[2], NULL, 0);
            uint8_t device_address = strtol(argv[3], NULL, 0);
            uint8_t register_address = strtol(argv[4], NULL, 0);
            uint8_t value = strtol(argv[5], NULL, 0);
            fprintf(stdout, "Device %02X, Register = %02X, Value = %02X\n", device_address,
                    register_address, value);
            if (i2c_set(bus, device_address, register_address, value) != MRAA_SUCCESS) {
                fprintf(stdout, "i2c set failed\n");
                return 0;
            }
            return 1;
        } else {
            print_command_error();
            return 1;
        }
    } else {
        print_command_error();
        return 1;
    }
}